

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# auto_map.cpp
# Opt level: O1

void __thiscall
CDoodadsMapper::PlaceDoodads
          (CDoodadsMapper *this,CLayerTiles *pLayer,CRule *pRule,
          array<array<int,_allocator_default<int>_>,_allocator_default<array<int,_allocator_default<int>_>_>_>
          *pPositions,int Amount,int LeftWall)

{
  int *piVar1;
  uchar *puVar2;
  int iVar3;
  CTile CVar4;
  CTile *pCVar5;
  array<int,_allocator_default<int>_> *paVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  ulong uVar16;
  char cVar17;
  int iVar18;
  int iVar19;
  long lVar20;
  uint uVar21;
  long lVar22;
  int iVar23;
  int iVar24;
  long in_FS_OFFSET;
  array<int,_allocator_default<int>_> aChainAfter;
  array<int,_allocator_default<int>_> aChainBefore;
  array<int,_allocator_default<int>_> local_58;
  array<int,_allocator_default<int>_> local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (pRule->m_Location == 1) {
    lVar10 = 0x14;
  }
  else {
    if (pRule->m_Location != 2) goto LAB_00191736;
    lVar10 = 0x10;
  }
  piVar1 = (int *)((long)&(pRule->m_Rect).field_0 + lVar10);
  *piVar1 = *piVar1 + 1;
LAB_00191736:
  if (LeftWall != 0) {
    pRule->m_HFlip = pRule->m_HFlip ^ LeftWall;
    (pRule->m_RelativePos).field_0.x =
         2 - ((pRule->m_RelativePos).field_0.x + (pRule->m_Size).field_0.x);
  }
  iVar24 = pRule->m_Random;
  uVar11 = (uint)(((101.0 - (float)Amount) / 100.0) * (float)iVar24);
  if (iVar24 == 1) {
    uVar11 = 1;
  }
  uVar12 = 2;
  if (2 < (int)uVar11) {
    uVar12 = uVar11;
  }
  if (iVar24 < 2) {
    uVar12 = uVar11;
  }
  if (0 < pPositions->num_elements) {
    iVar24 = pLayer->m_Height * pLayer->m_Width;
    lVar10 = 0;
    do {
      iVar7 = pPositions->list[lVar10].num_elements;
      if (0 < iVar7) {
        uVar11 = 0;
        do {
          if ((((uint)pRule->m_Location < 2) && ((int)(iVar7 - uVar11) < (pRule->m_Size).field_0.x))
             || ((pRule->m_Location == 2 && ((int)(iVar7 - uVar11) < (pRule->m_Size).field_1.y))))
          break;
          if ((int)uVar12 < 2) {
LAB_0019182f:
            iVar7 = pPositions->list[lVar10].list[(int)uVar11];
            iVar3 = (pRule->m_RelativePos).field_0.x;
            uVar8 = pLayer->m_Width;
            iVar13 = (pRule->m_RelativePos).field_1.y * uVar8;
            uVar9 = iVar13 + iVar3 + iVar7;
            if (0 < (pRule->m_Size).field_1.y) {
              uVar16 = (ulong)uVar9;
              cVar17 = '\0';
              lVar20 = 0;
              do {
                if (0 < (pRule->m_Size).field_0.x) {
                  lVar22 = 0;
                  do {
                    iVar14 = (int)(uVar16 + lVar22);
                    if (iVar14 < iVar24 && 0 < iVar14) {
                      pLayer->m_pTiles[uVar16 + lVar22 & 0xffffffff].m_Index =
                           cVar17 + (char)lVar22 + (char)(pRule->m_Rect).field_0.x;
                    }
                    lVar22 = lVar22 + 1;
                  } while (lVar22 < (pRule->m_Size).field_0.x);
                }
                lVar20 = lVar20 + 1;
                uVar16 = uVar16 + uVar8;
                cVar17 = cVar17 + '\x10';
              } while (lVar20 < (pRule->m_Size).field_1.y);
            }
            if (pRule->m_HFlip != 0) {
              if (0 < (pRule->m_Size).field_1.y) {
                iVar14 = 0;
                do {
                  iVar15 = (pRule->m_Size).field_0.x;
                  if (1 < iVar15) {
                    iVar18 = 0;
                    iVar19 = iVar7 + iVar3 + iVar13;
                    do {
                      iVar19 = iVar19 + -1;
                      iVar23 = pLayer->m_Width * iVar14;
                      uVar8 = uVar9 + iVar18 + iVar23;
                      if (((int)uVar8 < iVar24 && 0 < (int)uVar8) &&
                         (uVar21 = iVar15 + iVar19 + iVar23, (int)uVar21 < iVar24 && 0 < (int)uVar21
                         )) {
                        pCVar5 = pLayer->m_pTiles;
                        CVar4 = pCVar5[uVar8];
                        pCVar5[uVar8] = pCVar5[uVar21];
                        pLayer->m_pTiles[uVar21] = CVar4;
                      }
                      iVar18 = iVar18 + 1;
                      iVar15 = (pRule->m_Size).field_0.x;
                    } while (iVar18 < iVar15 / 2);
                  }
                  iVar14 = iVar14 + 1;
                } while (iVar14 < (pRule->m_Size).field_1.y);
              }
              if (0 < (pRule->m_Size).field_1.y) {
                iVar14 = 0;
                do {
                  if (0 < (pRule->m_Size).field_0.x) {
                    iVar15 = pLayer->m_Width;
                    lVar20 = 0;
                    do {
                      uVar16 = (ulong)(uint)(iVar15 * iVar14 + iVar7 + iVar3 + iVar13) + lVar20;
                      iVar19 = (int)uVar16;
                      if (iVar19 < iVar24 && 0 < iVar19) {
                        puVar2 = &pLayer->m_pTiles[uVar16 & 0xffffffff].m_Flags;
                        *puVar2 = *puVar2 ^ 1;
                      }
                      lVar20 = lVar20 + 1;
                    } while (lVar20 < (pRule->m_Size).field_0.x);
                  }
                  iVar14 = iVar14 + 1;
                } while (iVar14 < (pRule->m_Size).field_1.y);
              }
            }
            if (pRule->m_VFlip != 0) {
              if (1 < (pRule->m_Size).field_1.y) {
                iVar14 = 0;
                iVar15 = -1;
                do {
                  if (0 < (pRule->m_Size).field_0.x) {
                    iVar19 = 0;
                    do {
                      uVar8 = iVar14 * pLayer->m_Width + uVar9 + iVar19;
                      if (((int)uVar8 < iVar24 && 0 < (int)uVar8) &&
                         (uVar21 = uVar9 + iVar19 +
                                   pLayer->m_Width * ((pRule->m_Size).field_1.y + iVar15),
                         (int)uVar21 < iVar24 && 0 < (int)uVar21)) {
                        pCVar5 = pLayer->m_pTiles;
                        CVar4 = pCVar5[uVar8];
                        pCVar5[uVar8] = pCVar5[uVar21];
                        pLayer->m_pTiles[uVar21] = CVar4;
                      }
                      iVar19 = iVar19 + 1;
                    } while (iVar19 < (pRule->m_Size).field_0.x);
                  }
                  iVar14 = iVar14 + 1;
                  iVar15 = iVar15 + -1;
                } while (iVar14 < (pRule->m_Size).field_1.y / 2);
              }
              if (0 < (pRule->m_Size).field_1.y) {
                iVar14 = 0;
                do {
                  if (0 < (pRule->m_Size).field_0.x) {
                    iVar15 = pLayer->m_Width;
                    lVar20 = 0;
                    do {
                      uVar16 = (ulong)(uint)(iVar15 * iVar14 + iVar7 + iVar3 + iVar13) + lVar20;
                      iVar19 = (int)uVar16;
                      if (iVar19 < iVar24 && 0 < iVar19) {
                        puVar2 = &pLayer->m_pTiles[uVar16 & 0xffffffff].m_Flags;
                        *puVar2 = *puVar2 ^ 2;
                      }
                      lVar20 = lVar20 + 1;
                    } while (lVar20 < (pRule->m_Size).field_0.x);
                  }
                  iVar14 = iVar14 + 1;
                } while (iVar14 < (pRule->m_Size).field_1.y);
              }
            }
            if (1 < (int)uVar12) {
              local_48.list = (int *)0x0;
              local_48.list_size = 1;
              local_48.list = (int *)operator_new__(4);
              local_48.num_elements = 0;
              local_58.list = (int *)0x0;
              local_58.list_size = 1;
              local_58.list = (int *)operator_new__(4);
              local_58.num_elements = 0;
              if (0 < (int)uVar11) {
                lVar20 = 0;
                do {
                  array<int,_allocator_default<int>_>::add
                            (&local_48,(int *)((long)pPositions->list[lVar10].list + lVar20));
                  lVar20 = lVar20 + 4;
                } while ((ulong)uVar11 << 2 != lVar20);
              }
              iVar7 = (&(pRule->m_Size).field_0)[pRule->m_Location == 2].x;
              paVar6 = pPositions->list;
              if ((int)(uVar11 + iVar7) < paVar6[lVar10].num_elements) {
                lVar22 = (long)(int)uVar11 + (long)iVar7;
                lVar20 = lVar22 * 4;
                do {
                  array<int,_allocator_default<int>_>::add
                            (&local_58,(int *)((long)paVar6[lVar10].list + lVar20));
                  lVar22 = lVar22 + 1;
                  paVar6 = pPositions->list;
                  lVar20 = lVar20 + 4;
                } while (lVar22 < paVar6[lVar10].num_elements);
              }
              array<array<int,_allocator_default<int>_>,_allocator_default<array<int,_allocator_default<int>_>_>_>
              ::remove_index(pPositions,(int)lVar10);
              if (1 < local_48.num_elements) {
                array<array<int,_allocator_default<int>_>,_allocator_default<array<int,_allocator_default<int>_>_>_>
                ::add(pPositions,&local_48);
              }
              if (1 < local_58.num_elements) {
                array<array<int,_allocator_default<int>_>,_allocator_default<array<int,_allocator_default<int>_>_>_>
                ::add(pPositions,&local_58);
              }
              if (local_58.list != (int *)0x0) {
                operator_delete__(local_58.list);
              }
              if (local_48.list != (int *)0x0) {
                operator_delete__(local_48.list);
              }
              uVar11 = 0xffffffff;
            }
          }
          else {
            uVar8 = rand();
            uVar9 = rand();
            if (((uVar8 & 0x7fff) << 0x10 | uVar9 & 0xffff) % uVar12 == 0) goto LAB_0019182f;
          }
          uVar11 = uVar11 + (pRule->m_Size).field_0.x;
          iVar7 = pPositions->list[lVar10].num_elements;
        } while ((int)uVar11 < iVar7);
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 < pPositions->num_elements);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CDoodadsMapper::PlaceDoodads(CLayerTiles *pLayer, CRule *pRule, array<array<int> > *pPositions, int Amount, int LeftWall)
{
	if(pRule->m_Location == CRule::CEILING)
		pRule->m_RelativePos.y++;
	else if(pRule->m_Location == CRule::WALLS)
		pRule->m_RelativePos.x++;

	// left walls
	if(LeftWall)
	{
		pRule->m_HFlip ^= LeftWall;
		pRule->m_RelativePos.x--;
		pRule->m_RelativePos.x = -pRule->m_RelativePos.x;
		pRule->m_RelativePos.x -= pRule->m_Size.x-1;
	}

	int MaxIndex = pLayer->m_Width*pLayer->m_Height;
	int RandomValue = pRule->m_Random*((101.f-Amount)/100.0f);

	if(pRule->m_Random == 1)
		RandomValue = 1;

	// allow diversity with high Amount
	if(pRule->m_Random > 1 && RandomValue <= 1)
		RandomValue = 2;

	for(int f = 0; f < pPositions->size(); f++)
		for(int c = 0; c < (*pPositions)[f].size(); c += pRule->m_Size.x)
		{
			if((pRule->m_Location == CRule::FLOOR || pRule->m_Location == CRule::CEILING)
				&& (*pPositions)[f].size()-c < pRule->m_Size.x)
			break;

			if(pRule->m_Location == CRule::WALLS && (*pPositions)[f].size()-c < pRule->m_Size.y)
				break;

			if(RandomValue > 1 && !IAutoMapper::Random(RandomValue))
				continue;

			// where to put it
			int ID = (*pPositions)[f][c];

			// relative position
			ID += pRule->m_RelativePos.x;
			ID += pRule->m_RelativePos.y*pLayer->m_Width;

			for(int y = 0; y < pRule->m_Size.y; y++)
				for(int x = 0; x < pRule->m_Size.x; x++)
				{
					int Index = y*pLayer->m_Width+x+ID;
					if(Index <= 0 || Index >= MaxIndex)
						continue;

					pLayer->m_pTiles[Index].m_Index = pRule->m_Rect.x+y*16+x;
				}

			// hflip
			if(pRule->m_HFlip)
			{
				for(int y = 0; y < pRule->m_Size.y; y++)
					for(int x = 0; x < pRule->m_Size.x/2; x++)
					{
						int Index = y*pLayer->m_Width+x+ID;
						if(Index <= 0 || Index >= MaxIndex)
							continue;

						int CheckIndex = Index+pRule->m_Size.x-1-x*2;

						if(CheckIndex <= 0 || CheckIndex >= MaxIndex)
							continue;

						CTile Tmp = pLayer->m_pTiles[Index];
						pLayer->m_pTiles[Index] = pLayer->m_pTiles[CheckIndex];
						pLayer->m_pTiles[CheckIndex] = Tmp;
					}

				for(int y = 0; y < pRule->m_Size.y; y++)
					for(int x = 0; x < pRule->m_Size.x; x++)
					{
						int Index = y*pLayer->m_Width+x+ID;
						if(Index <= 0 || Index >= MaxIndex)
							continue;

						pLayer->m_pTiles[Index].m_Flags ^= TILEFLAG_VFLIP;
					}
			}

			// vflip
			if(pRule->m_VFlip)
			{
				for(int y = 0; y < pRule->m_Size.y/2; y++)
					for(int x = 0; x < pRule->m_Size.x; x++)
					{
						int Index = y*pLayer->m_Width+x+ID;
						if(Index <= 0 || Index >= MaxIndex)
							continue;

						int CheckIndex = Index+(pRule->m_Size.y-1-y*2)*pLayer->m_Width;

						if(CheckIndex <= 0 || CheckIndex >= MaxIndex)
							continue;

						CTile Tmp = pLayer->m_pTiles[Index];
						pLayer->m_pTiles[Index] = pLayer->m_pTiles[CheckIndex];
						pLayer->m_pTiles[CheckIndex] = Tmp;
					}

				for(int y = 0; y < pRule->m_Size.y; y++)
					for(int x = 0; x < pRule->m_Size.x; x++)
					{
						int Index = y*pLayer->m_Width+x+ID;
						if(Index <= 0 || Index >= MaxIndex)
							continue;

						pLayer->m_pTiles[Index].m_Flags ^= TILEFLAG_HFLIP;
					}
			}

			// make the place occupied
			if(RandomValue > 1)
			{
				array<int> aChainBefore;
				array<int> aChainAfter;

				for(int j = 0; j < c; j++)
					aChainBefore.add((*pPositions)[f][j]);

				int Size = pRule->m_Size.x;
				if(pRule->m_Location == CRule::WALLS)
					Size = pRule->m_Size.y;

				for(int j = c+Size; j < (*pPositions)[f].size(); j++)
					aChainAfter.add((*pPositions)[f][j]);

				pPositions->remove_index(f);

				// f changes, reset c
				c = -1;

				if(aChainBefore.size() > 1)
					pPositions->add(aChainBefore);
				if(aChainAfter.size() > 1)
					pPositions->add(aChainAfter);
			}
		}
}